

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O0

void sexp_merge_sort(sexp_conflict ctx,sexp_conflict *vec,sexp_conflict *scratch,sexp_sint_t lo,
                    sexp_sint_t hi)

{
  undefined8 uVar1;
  long hi_00;
  sexp_sint_t sVar2;
  sexp_conflict *in_RCX;
  sexp_conflict *in_RDX;
  sexp_conflict in_RSI;
  sexp_conflict *in_R8;
  sexp_conflict tmp;
  sexp_sint_t k;
  sexp_sint_t j;
  sexp_sint_t i;
  sexp_sint_t mid;
  sexp_conflict *local_48;
  long local_40;
  sexp_conflict *local_38;
  sexp_conflict *ppsVar3;
  
  if (in_R8 == in_RCX) {
    in_RDX[(long)in_RCX] = *(sexp_conflict *)(&in_RSI->tag + (long)in_RCX * 2);
  }
  else {
    if ((long)in_R8 - (long)in_RCX != 1) {
      if ((long)in_R8 - (long)in_RCX != 2) {
        hi_00 = ((long)in_R8 + (long)in_RCX) / 2;
        sexp_merge_sort(in_RSI,in_RDX,in_RCX,(sexp_sint_t)in_R8,hi_00);
        local_48 = in_RCX;
        sexp_merge_sort(in_RSI,in_RDX,in_RCX,(sexp_sint_t)in_R8,hi_00);
        local_40 = hi_00 + 1;
        local_38 = local_48;
        ppsVar3 = local_48;
        for (; (long)local_48 <= (long)in_R8; local_48 = (sexp_conflict *)((long)local_48 + 1)) {
          if (hi_00 < (long)local_38) {
            in_RDX[(long)local_48] = *(sexp_conflict *)(&in_RSI->tag + local_40 * 2);
            local_40 = local_40 + 1;
          }
          else if ((long)in_R8 < local_40) {
            in_RDX[(long)local_48] = *(sexp_conflict *)(&in_RSI->tag + (long)local_38 * 2);
            local_38 = (sexp_conflict *)((long)local_38 + 1);
          }
          else {
            sVar2 = sexp_object_compare((sexp_conflict)mid,(sexp_conflict)i,(sexp_conflict)j,k._4_4_
                                       );
            if (sVar2 < 0) {
              in_RDX[(long)local_48] = *(sexp_conflict *)(&in_RSI->tag + local_40 * 2);
              local_40 = local_40 + 1;
            }
            else {
              in_RDX[(long)local_48] = *(sexp_conflict *)(&in_RSI->tag + (long)local_38 * 2);
              local_38 = (sexp_conflict *)((long)local_38 + 1);
            }
          }
        }
        memcpy(&in_RSI->tag + (long)ppsVar3 * 2,in_RDX + (long)ppsVar3,
               ((long)in_R8 + (1 - (long)ppsVar3)) * 8);
        return;
      }
      sVar2 = sexp_object_compare((sexp_conflict)mid,(sexp_conflict)i,(sexp_conflict)j,k._4_4_);
      if (sVar2 < 0) {
        uVar1 = *(undefined8 *)(&in_RSI->tag + (long)in_R8 * 2);
        *(undefined8 *)(&in_RSI->tag + (long)in_R8 * 2) =
             *(undefined8 *)((long)in_RSI + ((long)in_R8 + -1) * 8);
        *(undefined8 *)((long)in_RSI + ((long)in_R8 + -1) * 8) = uVar1;
      }
    }
    sVar2 = sexp_object_compare((sexp_conflict)mid,(sexp_conflict)i,(sexp_conflict)j,k._4_4_);
    if (sVar2 < 0) {
      uVar1 = *(undefined8 *)((long)&in_RSI->value + (long)in_RCX * 8);
      *(undefined8 *)((long)&in_RSI->value + (long)in_RCX * 8) =
           *(undefined8 *)(&in_RSI->tag + (long)in_RCX * 2);
      *(undefined8 *)(&in_RSI->tag + (long)in_RCX * 2) = uVar1;
      if ((1 < (long)in_R8 - (long)in_RCX) &&
         (sVar2 = sexp_object_compare((sexp_conflict)mid,(sexp_conflict)i,(sexp_conflict)j,k._4_4_),
         sVar2 < 0)) {
        uVar1 = *(undefined8 *)((long)&in_RSI->value + (long)in_RCX * 8 + 8);
        *(undefined8 *)((long)&in_RSI->value + (long)in_RCX * 8 + 8) =
             *(undefined8 *)((long)&in_RSI->value + (long)in_RCX * 8);
        *(undefined8 *)((long)&in_RSI->value + (long)in_RCX * 8) = uVar1;
      }
    }
  }
  return;
}

Assistant:

static void sexp_merge_sort (sexp ctx, sexp *vec, sexp *scratch, sexp_sint_t lo, sexp_sint_t hi) {
  sexp_sint_t mid, i, j, k;
  sexp tmp;
  switch (hi - lo) {
  case 0:
    scratch[lo] = vec[lo];
    break;
  case 2:
    if (sexp_object_compare(ctx, vec[hi], vec[hi-1], COMPARE_DEPTH) < 0)
      swap(tmp, vec[hi], vec[hi-1]);
    /* ... FALLTHROUGH ... */
  case 1:
    if (sexp_object_compare(ctx, vec[lo+1], vec[lo], COMPARE_DEPTH) < 0) {
      swap(tmp, vec[lo+1], vec[lo]);
      if (hi - lo > 1) {
        if (sexp_object_compare(ctx, vec[lo+2], vec[lo+1], COMPARE_DEPTH) < 0)
          swap(tmp, vec[lo+2], vec[lo+1]);
      }
    }
    break;
  default:                      /* at least 4 elements */
    mid = (hi+lo)/2;
    sexp_merge_sort(ctx, vec, scratch, lo, mid);
    sexp_merge_sort(ctx, vec, scratch, mid+1, hi);
    for (k=lo, i = lo, j = mid+1; k <= hi; ++k) {
      if (i > mid) {
        scratch[k] = vec[j++];
      } else if (j > hi) {
        scratch[k] = vec[i++];
      } else {
        if (sexp_object_compare(ctx, vec[j], vec[i], COMPARE_DEPTH) < 0) {
          scratch[k] = vec[j++];
        } else {
          scratch[k] = vec[i++];
        }
      }
    }
    memcpy(vec + lo, scratch + lo, (hi-lo+1) * sizeof(sexp));
  }
}